

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O2

_Bool borg_tell(char *what)

{
  borg_keypress(0x3a);
  borg_keypresses(what);
  borg_keypress(0x9c);
  return true;
}

Assistant:

bool borg_tell(char* what)
{
    /* Hack -- self note */
    borg_keypress(':');
    borg_keypresses(what);
    borg_keypress(KC_ENTER);

    /* Success */
    return (true);
}